

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinCeil
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  const_reference pvVar1;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  long in_RDI;
  Value VVar2;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_00000220;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000228;
  string *in_stack_00000230;
  LocationRange *in_stack_00000238;
  Interpreter *in_stack_00000240;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *this_00;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar3;
  allocator_type local_39;
  string local_38 [8];
  double in_stack_ffffffffffffffd0;
  LocationRange *in_stack_ffffffffffffffd8;
  Interpreter *in_stack_ffffffffffffffe0;
  
  __a = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
             ,(allocator<char> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  uVar3 = 2;
  this_00 = (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)&stack0xffffffffffffff83;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2239ed);
  __l._M_len._0_4_ = in_stack_ffffffffffffff80;
  __l._M_array = (iterator)in_stack_ffffffffffffff78;
  __l._M_len._4_4_ = uVar3;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),__l,__a);
  validateBuiltinArgs(in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_00000228,
                      in_stack_00000220);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector(this_00);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x223a3f);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](in_RDX,0);
  ceil((pvVar1->v).d);
  VVar2 = makeNumberCheck(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd0);
  *(ulong *)(in_RDI + 0x40) = CONCAT44(in_stack_ffffffffffffff74,VVar2.t);
  *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = VVar2.v;
  return (AST *)0x0;
}

Assistant:

const AST *builtinCeil(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "ceil", args, {Value::NUMBER});
        scratch = makeNumberCheck(loc, std::ceil(args[0].v.d));
        return nullptr;
    }